

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O0

void __thiscall webrtc::PushResampler<short>::~PushResampler(PushResampler<short> *this)

{
  PushResampler<short> *this_local;
  
  this->_vptr_PushResampler = (_func_int **)&PTR__PushResampler_002fb7b0;
  std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr(&this->dst_right_);
  std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr(&this->dst_left_);
  std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr(&this->src_right_);
  std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr(&this->src_left_);
  std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>::
  ~unique_ptr(&this->sinc_resampler_right_);
  std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>::
  ~unique_ptr(&this->sinc_resampler_);
  return;
}

Assistant:

PushResampler<T>::~PushResampler() {
}